

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O0

void IR::Opnd::DumpFunctionInfo
               (char16 **buffer,size_t *count,FunctionInfo *info,bool printToConsole,char16 *type)

{
  char16 *pcVar1;
  BOOL BVar2;
  int iVar3;
  FunctionProxy *this;
  undefined4 extraout_var;
  char16 *pcVar4;
  FunctionProxy *proxy;
  char16 debugStringBuffer [42];
  char16 *type_local;
  bool printToConsole_local;
  FunctionInfo *info_local;
  size_t *count_local;
  char16 **buffer_local;
  
  unique0x100000e6 = type;
  BVar2 = Js::FunctionInfo::HasBody(info);
  if (BVar2 == 0) {
    if (stack0xffffffffffffffd0 == (char16 *)0x0) {
      stack0xffffffffffffffd0 = L"FunctionInfo";
    }
    WriteToBuffer(buffer,count,L" (%s)",stack0xffffffffffffffd0);
  }
  else {
    if (stack0xffffffffffffffd0 == (char16 *)0x0) {
      stack0xffffffffffffffd0 = L"FunctionBody";
    }
    this = Js::FunctionInfo::GetFunctionProxy(info);
    pcVar1 = stack0xffffffffffffffd0;
    iVar3 = (*(this->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[7])();
    pcVar4 = Js::FunctionProxy::GetDebugNumberSet(this,(wchar (*) [42])&proxy);
    WriteToBuffer(buffer,count,L" (%s [%s%s])",pcVar1,CONCAT44(extraout_var,iVar3),pcVar4);
  }
  return;
}

Assistant:

void
Opnd::DumpFunctionInfo(_Outptr_result_buffer_(*count) char16 ** buffer, size_t * count, Js::FunctionInfo * info, bool printToConsole, _In_opt_z_ char16 const * type)
{
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
    if (info->HasBody())
    {
        if (type == nullptr)
        {
            type = _u("FunctionBody");
        }
        Js::FunctionProxy * proxy = info->GetFunctionProxy();
        WriteToBuffer(buffer, count, _u(" (%s [%s%s])"), type, proxy->GetDisplayName(), proxy->GetDebugNumberSet(debugStringBuffer));
    }
    else
    {
        if (type == nullptr)
        {
            type = _u("FunctionInfo");
        }
        WriteToBuffer(buffer, count, _u(" (%s)"), type);
    }
}